

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c
# Opt level: O1

sexp_conflict
json_write_array(sexp_conflict ctx,sexp_conflict self,sexp_conflict obj,sexp_conflict out)

{
  sexp_uint_t sVar1;
  sexp psVar2;
  sexp psVar3;
  sexp_conflict psVar4;
  ulong uVar5;
  uint uVar6;
  
  sVar1 = (obj->value).vector.length;
  if ((out->value).type.setters == (sexp)0x0) {
    fputs("[",(FILE *)(out->value).type.getters);
  }
  else {
    sexp_buffered_write_string(ctx,"[",out);
  }
  uVar6 = (uint)sVar1;
  if (0 < (int)uVar6) {
    uVar5 = 0;
    do {
      psVar4 = json_write(ctx,self,*(sexp_conflict *)((long)&obj->value + uVar5 * 8 + 8),out);
      if ((((ulong)psVar4 & 3) == 0) && (psVar4->tag == 0x13)) {
        return psVar4;
      }
      if ((long)uVar5 < (long)(int)(uVar6 - 1)) {
        psVar2 = (out->value).type.setters;
        if (psVar2 == (sexp)0x0) {
          putc(0x2c,(FILE *)(out->value).type.getters);
        }
        else {
          psVar3 = (out->value).type.print;
          if (psVar3 < (sexp)(out->value).port.size) {
            (out->value).type.print = (sexp)((long)&psVar3->tag + 1);
            *(undefined1 *)((long)&psVar3->tag + (long)&psVar2->tag) = 0x2c;
          }
          else {
            sexp_buffered_write_char(ctx,0x2c,out);
          }
        }
      }
      uVar5 = uVar5 + 1;
    } while ((uVar6 & 0x7fffffff) != uVar5);
  }
  if ((out->value).type.setters == (sexp)0x0) {
    fputs("]",(FILE *)(out->value).type.getters);
  }
  else {
    sexp_buffered_write_string(ctx,"]",out);
  }
  return (sexp_conflict)&DAT_0000043e;
}

Assistant:

sexp json_write_array(sexp ctx, sexp self, const sexp obj, sexp out) {
  sexp tmp;
  int len = sexp_vector_length(obj), i;
  sexp_write_string(ctx, "[", out);
  for (i = 0; i < len; ++i) {
    tmp = json_write(ctx, self, sexp_vector_ref(obj, sexp_make_fixnum(i)), out);
    if (sexp_exceptionp(tmp)) {
      return tmp;
    }
    if (i < len - 1) {
      sexp_write_char(ctx, ',', out);
    }
  }
  sexp_write_string(ctx, "]", out);
  return SEXP_VOID;
}